

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndFrame(void)

{
  ImVector<ImGuiWindow_*> *this;
  ImVec2 IVar1;
  ImVec2 IVar2;
  uint move_flags;
  _func_void_int_int *p_Var3;
  ImGuiViewportP *pIVar4;
  char *text;
  ImGuiContext *pIVar5;
  ImGuiContext *ctx;
  bool bVar6;
  int iVar7;
  ImGuiWindow *pIVar8;
  char *pcVar9;
  byte bVar10;
  ulong uVar11;
  byte bVar12;
  char *label;
  int i;
  ImGuiDir clip_dir;
  ImGuiContext *g;
  uint uVar13;
  float fVar14;
  float fVar15;
  ImVec2 IVar16;
  float fVar17;
  float fVar18;
  ImRect local_48;
  
  ctx = GImGui;
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  CallContextHooks(GImGui,ImGuiContextHookType_EndFramePre);
  pIVar5 = GImGui;
  iVar7 = (GImGui->CurrentWindowStack).Size;
  if (1 < iVar7) {
    while (1 < iVar7) {
      End();
      iVar7 = (pIVar5->CurrentWindowStack).Size;
    }
  }
  p_Var3 = (ctx->IO).ImeSetInputScreenPosFn;
  if (p_Var3 != (_func_void_int_int *)0x0) {
    fVar17 = (ctx->PlatformImeLastPos).x;
    if ((fVar17 != 3.4028235e+38) || (NAN(fVar17))) {
      fVar15 = (ctx->PlatformImePos).x;
      fVar14 = (ctx->PlatformImePos).y;
      fVar18 = (ctx->PlatformImeLastPos).y - fVar14;
      if ((fVar17 - fVar15) * (fVar17 - fVar15) + fVar18 * fVar18 <= 0.0001) goto LAB_00123ea2;
    }
    else {
      fVar15 = (ctx->PlatformImePos).x;
      fVar14 = (ctx->PlatformImePos).y;
    }
    (*p_Var3)((int)fVar15,(int)fVar14);
    ctx->PlatformImeLastPos = ctx->PlatformImePos;
  }
LAB_00123ea2:
  ctx->WithinFrameScopeWithImplicitWindow = false;
  pIVar8 = ctx->CurrentWindow;
  if ((pIVar8 != (ImGuiWindow *)0x0) && (pIVar8->WriteAccessed == false)) {
    pIVar8->Active = false;
  }
  End();
  pIVar5 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      pIVar8 = FindWindowByName("###NavWindowingList");
      pIVar5->NavWindowingListWindow = pIVar8;
    }
    pIVar4 = *(pIVar5->Viewports).Data;
    IVar1 = (pIVar4->super_ImGuiViewport).Size;
    IVar2.y = IVar1.y * 0.2;
    IVar2.x = IVar1.x * 0.2;
    (pIVar5->NextWindowData).SizeConstraintRect.Min = IVar2;
    (pIVar5->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar5->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar5->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar5->NextWindowData).SizeCallbackUserData = (void *)0x0;
    IVar1 = (pIVar4->super_ImGuiViewport).Pos;
    IVar2 = (pIVar4->super_ImGuiViewport).Size;
    IVar16.x = IVar2.x * 0.5 + IVar1.x;
    IVar16.y = IVar2.y * 0.5 + IVar1.y;
    (pIVar5->NextWindowData).Flags = (pIVar5->NextWindowData).Flags | 0x11;
    (pIVar5->NextWindowData).PosVal = IVar16;
    (pIVar5->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar5->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar5->NextWindowData).PosCond = 1;
    IVar1 = (pIVar5->Style).WindowPadding;
    fVar17 = IVar1.x;
    fVar15 = IVar1.y;
    local_48.Min.y = fVar15 + fVar15;
    local_48.Min.x = fVar17 + fVar17;
    PushStyleVar(1,&local_48.Min);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    for (uVar11 = (ulong)(uint)(pIVar5->WindowsFocusOrder).Size; 0 < (int)uVar11;
        uVar11 = uVar11 - 1) {
      pIVar8 = (pIVar5->WindowsFocusOrder).Data[uVar11 - 1];
      bVar6 = IsWindowNavFocusable(pIVar8);
      if (bVar6) {
        text = pIVar8->Name;
        pcVar9 = FindRenderedTextEnd(text,(char *)0x0);
        label = text;
        if (text == pcVar9) {
          label = "(Popup)";
          if (((uint)pIVar8->Flags >> 0x1a & 1) == 0) {
            if (((uint)pIVar8->Flags >> 10 & 1) != 0) {
              iVar7 = strcmp(text,"##MainMenuBar");
              label = "(Main menu bar)";
              if (iVar7 == 0) goto LAB_00124032;
            }
            label = "(Untitled)";
          }
        }
LAB_00124032:
        local_48.Min.x = 0.0;
        local_48.Min.y = 0.0;
        Selectable(label,pIVar5->NavWindowingTarget == pIVar8,0,&local_48.Min);
      }
    }
    End();
    PopStyleVar(1);
  }
  pIVar8 = pIVar5->NavWrapRequestWindow;
  if ((pIVar8 != (ImGuiWindow *)0x0) && (pIVar5->NavWindow == pIVar8)) {
    move_flags = pIVar5->NavWrapRequestFlags;
    bVar6 = NavMoveRequestButNoResultYet();
    if ((bVar6) &&
       ((pIVar5->NavMoveRequestForward == ImGuiNavForward_None &&
        (pIVar5->NavLayer == ImGuiNavLayer_Main)))) {
      local_48.Min = pIVar8->NavRectRel[0].Min;
      local_48.Max = pIVar8->NavRectRel[0].Max;
      iVar7 = pIVar5->NavMoveDir;
      bVar6 = (move_flags & 5) == 0;
      clip_dir = iVar7;
      if (iVar7 == 0) {
        if ((move_flags & 5) != 0) {
          fVar17 = (pIVar8->SizeFull).x;
          fVar15 = (pIVar8->WindowPadding).x;
          fVar15 = fVar15 + fVar15 + (pIVar8->ContentSize).x;
          uVar13 = -(uint)(fVar15 <= fVar17);
          fVar17 = (float)(uVar13 & (uint)fVar17 | ~uVar13 & (uint)fVar15) - (pIVar8->Scroll).x;
          clip_dir = 0;
          if ((move_flags & 4) != 0) {
            fVar15 = local_48.Max.y - local_48.Min.y;
            local_48.Min.y = local_48.Min.y - fVar15;
            local_48.Max.y = local_48.Max.y - fVar15;
            clip_dir = 2;
          }
          local_48.Max.x = fVar17;
          local_48.Min.x = fVar17;
          bVar6 = false;
          NavMoveRequestForward(0,clip_dir,&local_48,move_flags);
          iVar7 = pIVar5->NavMoveDir;
          goto LAB_00124173;
        }
        iVar7 = 0;
        clip_dir = 0;
      }
      else {
LAB_00124173:
        if (iVar7 == 1 && !bVar6) {
          fVar17 = (pIVar8->Scroll).x;
          fVar14 = local_48.Max.y;
          local_48.Max = (ImVec2)(CONCAT44(local_48.Max.y,fVar17) ^ 0x80000000);
          fVar15 = local_48.Min.y;
          local_48.Min = (ImVec2)(CONCAT44(local_48.Min.y,fVar17) ^ 0x80000000);
          if ((move_flags & 4) != 0) {
            fVar17 = fVar14 - fVar15;
            local_48.Min.y = fVar15 + fVar17;
            local_48.Max.y = fVar17 + fVar14;
            clip_dir = 3;
          }
          NavMoveRequestForward(1,clip_dir,&local_48,move_flags);
          iVar7 = pIVar5->NavMoveDir;
        }
      }
      if ((move_flags & 10) != 0 && iVar7 == 2) {
        fVar17 = (pIVar8->SizeFull).y;
        fVar15 = (pIVar8->WindowPadding).y;
        fVar15 = fVar15 + fVar15 + (pIVar8->ContentSize).y;
        uVar13 = -(uint)(fVar15 <= fVar17);
        fVar17 = (float)(uVar13 & (uint)fVar17 | ~uVar13 & (uint)fVar15) - (pIVar8->Scroll).y;
        if ((move_flags & 8) != 0) {
          fVar15 = local_48.Max.x - local_48.Min.x;
          local_48.Min.x = local_48.Min.x - fVar15;
          local_48.Max.x = local_48.Max.x - fVar15;
          clip_dir = 0;
        }
        local_48.Max.y = fVar17;
        local_48.Min.y = fVar17;
        NavMoveRequestForward(2,clip_dir,&local_48,move_flags);
        iVar7 = pIVar5->NavMoveDir;
      }
      if (iVar7 == 3 && (move_flags & 10) != 0) {
        fVar17 = (pIVar8->Scroll).y;
        fVar14 = local_48.Max.x;
        local_48.Max = (ImVec2)(CONCAT44(fVar17,local_48.Max.x) ^ 0x8000000000000000);
        fVar15 = local_48.Min.x;
        local_48.Min = (ImVec2)(CONCAT44(fVar17,local_48.Min.x) ^ 0x8000000000000000);
        if ((move_flags & 8) != 0) {
          clip_dir = 1;
          fVar17 = fVar14 - fVar15;
          local_48.Min.x = fVar15 + fVar17;
          local_48.Max.x = fVar17 + fVar14;
        }
        NavMoveRequestForward(3,clip_dir,&local_48,move_flags);
      }
    }
  }
  bVar10 = ctx->DragDropActive;
  iVar7 = ctx->FrameCount;
  if ((bool)bVar10 != true) goto LAB_00124352;
  if ((ctx->DragDropPayload).DataFrameCount + 1 < iVar7) {
    if ((ctx->DragDropSourceFlags & 0x20) == 0) {
      bVar12 = (GImGui->IO).MouseDown[ctx->DragDropMouseButton] ^ 1;
      goto LAB_00124338;
    }
  }
  else {
    bVar12 = 0;
LAB_00124338:
    if ((bVar12 == 0) && ((ctx->DragDropPayload).Delivery == false)) goto LAB_00124352;
  }
  ClearDragDrop();
  bVar10 = ctx->DragDropActive;
  iVar7 = ctx->FrameCount;
LAB_00124352:
  if ((((bVar10 & 1) != 0) && (ctx->DragDropSourceFrameCount < iVar7)) &&
     ((ctx->DragDropSourceFlags & 1) == 0)) {
    ctx->DragDropWithinSource = true;
    SetTooltip("...");
    ctx->DragDropWithinSource = false;
    iVar7 = ctx->FrameCount;
  }
  ctx->WithinFrameScope = false;
  ctx->FrameCountEnded = iVar7;
  UpdateMouseMovingWindowEndFrame();
  this = &ctx->WindowsTempSortBuffer;
  ImVector<ImGuiWindow_*>::resize(this,0);
  ImVector<ImGuiWindow_*>::reserve(this,(ctx->Windows).Size);
  for (uVar11 = 0; uVar11 != (uint)(ctx->Windows).Size; uVar11 = uVar11 + 1) {
    pIVar8 = (ctx->Windows).Data[uVar11];
    if ((pIVar8->Active != true) || ((pIVar8->Flags & 0x1000000) == 0)) {
      AddWindowToSortBuffer(this,pIVar8);
    }
  }
  ImVector<ImGuiWindow_*>::swap(&ctx->Windows,this);
  (ctx->IO).MetricsActiveWindows = ctx->WindowsActiveCount;
  ((ctx->IO).Fonts)->Locked = false;
  (ctx->IO).MouseWheel = 0.0;
  (ctx->IO).MouseWheelH = 0.0;
  ImVector<unsigned_short>::resize(&(ctx->IO).InputQueueCharacters,0);
  (ctx->IO).NavInputs[0x10] = 0.0;
  (ctx->IO).NavInputs[0x11] = 0.0;
  (ctx->IO).NavInputs[0x12] = 0.0;
  (ctx->IO).NavInputs[0x13] = 0.0;
  (ctx->IO).NavInputs[0xc] = 0.0;
  (ctx->IO).NavInputs[0xd] = 0.0;
  (ctx->IO).NavInputs[0xe] = 0.0;
  (ctx->IO).NavInputs[0xf] = 0.0;
  (ctx->IO).NavInputs[8] = 0.0;
  (ctx->IO).NavInputs[9] = 0.0;
  (ctx->IO).NavInputs[10] = 0.0;
  (ctx->IO).NavInputs[0xb] = 0.0;
  (ctx->IO).NavInputs[4] = 0.0;
  (ctx->IO).NavInputs[5] = 0.0;
  (ctx->IO).NavInputs[6] = 0.0;
  (ctx->IO).NavInputs[7] = 0.0;
  (ctx->IO).NavInputs[0] = 0.0;
  (ctx->IO).NavInputs[1] = 0.0;
  (ctx->IO).NavInputs[2] = 0.0;
  (ctx->IO).NavInputs[3] = 0.0;
  (ctx->IO).NavInputs[0x14] = 0.0;
  CallContextHooks(ctx,ImGuiContextHookType_EndFramePost);
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}